

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeinApi.c
# Opt level: O0

int skeinUpdate(SkeinCtx_t *ctx,uint8_t *msg,size_t msgByteCnt)

{
  u64b_t uVar1;
  int local_2c;
  int ret;
  size_t msgByteCnt_local;
  uint8_t *msg_local;
  SkeinCtx_t *ctx_local;
  
  local_2c = 1;
  if (ctx == (SkeinCtx_t *)0x0) {
    ctx_local._4_4_ = 1;
  }
  else {
    uVar1 = ctx->skeinSize;
    if (uVar1 == 0x100) {
      local_2c = Skein_256_Update(&(ctx->m).s256,msg,msgByteCnt);
    }
    else if (uVar1 == 0x200) {
      local_2c = Skein_512_Update(&(ctx->m).s512,msg,msgByteCnt);
    }
    else if (uVar1 == 0x400) {
      local_2c = Skein1024_Update(&(ctx->m).s1024,msg,msgByteCnt);
    }
    ctx_local._4_4_ = local_2c;
  }
  return ctx_local._4_4_;
}

Assistant:

int skeinUpdate(SkeinCtx_t *ctx, const uint8_t *msg,
                size_t msgByteCnt)
{
    int ret = SKEIN_FAIL;
    Skein_Assert(ctx, SKEIN_FAIL);

    switch (ctx->skeinSize) {
    case Skein256:
        ret = Skein_256_Update(&ctx->m.s256, (const u08b_t*)msg, msgByteCnt);
        break;
    case Skein512:
        ret = Skein_512_Update(&ctx->m.s512, (const u08b_t*)msg, msgByteCnt);
        break;
    case Skein1024:
        ret = Skein1024_Update(&ctx->m.s1024, (const u08b_t*)msg, msgByteCnt);
        break;
    }
    return ret;

}